

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

char * cmTargetPropertyComputer::GetSources<cmTarget>
                 (cmTarget *tgt,cmMessenger *messenger,cmListFileBacktrace *context)

{
  cmTargetInternals *pcVar1;
  char *__s1;
  pointer pcVar2;
  pointer pbVar3;
  int iVar4;
  PolicyStatus PVar5;
  size_type sVar6;
  size_t sVar7;
  cmSourceFile *this;
  cmSourceFileLocation *pcVar8;
  ostream *poVar9;
  PolicyID id;
  string *arg;
  _Alloc_hider _Var10;
  char *__s;
  pointer input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string objLibName;
  ostringstream e;
  ostringstream ss;
  undefined1 local_3a8 [32];
  cmListFileBacktrace *local_388;
  cmTarget *local_380;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  cmMessenger *local_358;
  string *local_350;
  string *local_348;
  string local_340;
  _Base_ptr *local_320;
  long local_318;
  _Base_ptr local_310 [12];
  ios_base local_2b0 [264];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  pcVar1 = (tgt->Internal).Pointer;
  arg = (pcVar1->SourceEntries).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_350 = (pcVar1->SourceEntries).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (arg == local_350) {
    _Var10._M_p = (pointer)0x0;
  }
  else {
    local_388 = context;
    local_380 = tgt;
    local_358 = messenger;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    __s = "";
    do {
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_348 = arg;
      cmSystemTools::ExpandListArgument(arg,&local_378,false);
      pbVar3 = local_378.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (input = local_378.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; input != pbVar3; input = input + 1) {
        __s1 = (input->_M_dataplus)._M_p;
        iVar4 = strncmp(__s1,"$<TARGET_OBJECTS:",0x11);
        if ((iVar4 == 0) && (__s1[input->_M_string_length - 1] == '>')) {
          std::__cxx11::string::substr((ulong)&local_340,(ulong)input);
          sVar6 = cmGeneratorExpression::Find(&local_340);
          if (sVar6 == 0xffffffffffffffff) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
            cmListFileBacktrace::GetBottom((cmStateSnapshot *)local_3a8,local_388);
            PVar5 = cmStateSnapshot::GetPolicy((cmStateSnapshot *)local_3a8,CMP0051,false);
            if (PVar5 - NEW < 3) {
              if (__s == (char *)0x0) {
                std::ios::clear((int)local_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200)
                ;
              }
              else {
                sVar7 = strlen(__s);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(input->_M_dataplus)._M_p,input->_M_string_length);
              __s = ";";
            }
            else if (PVar5 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_3a8,(cmPolicies *)0x33,id);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_320,(char *)local_3a8._0_8_,local_3a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              if ((cmState *)local_3a8._0_8_ != (cmState *)(local_3a8 + 0x10)) {
                operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_320,"Target \"",8);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_320,(local_380->Name)._M_dataplus._M_p,
                                  (local_380->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,
                         "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                         ,0x12d);
              std::__cxx11::stringbuf::str();
              cmMessenger::IssueMessage(local_358,AUTHOR_WARNING,(string *)local_3a8,local_388);
              if ((cmState *)local_3a8._0_8_ != (cmState *)(local_3a8 + 0x10)) {
                operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
              }
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
            std::ios_base::~ios_base(local_2b0);
          }
          else {
            if (__s == (char *)0x0) {
              std::ios::clear((int)local_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200);
            }
            else {
              sVar7 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(input->_M_dataplus)._M_p,input->_M_string_length);
            __s = ";";
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          sVar6 = cmGeneratorExpression::Find(input);
          if (sVar6 == 0xffffffffffffffff) {
            if (__s == (char *)0x0) {
              std::ios::clear((int)local_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200);
            }
            else {
              sVar7 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(input->_M_dataplus)._M_p,input->_M_string_length);
            __s = ";";
          }
          else {
            this = cmMakefile::GetOrCreateSource(local_380->Makefile,input,false,Ambiguous);
            pcVar8 = cmSourceFile::GetLocation(this);
            local_320 = local_310;
            pcVar2 = (pcVar8->Directory)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_320,pcVar2,pcVar2 + (pcVar8->Directory)._M_string_length);
            if (local_318 != 0) {
              std::__cxx11::string::append((char *)&local_320);
            }
            std::__cxx11::string::_M_append
                      ((char *)&local_320,(ulong)(pcVar8->Name)._M_dataplus._M_p);
            if (__s == (char *)0x0) {
              std::ios::clear((int)local_3a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x200);
            }
            else {
              sVar7 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_320,local_318);
            if (local_320 != local_310) {
              operator_delete(local_320,(ulong)((long)&local_310[0]->_M_color + 1));
            }
            __s = ";";
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_378);
      arg = local_348 + 1;
    } while (arg != local_350);
    if (GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
        srcs_abi_cxx11_ == '\0') {
      GetSources<cmTarget>();
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=
              ((string *)
               &GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
                srcs_abi_cxx11_,(string *)&local_320);
    if (local_320 != local_310) {
      operator_delete(local_320,(ulong)((long)&local_310[0]->_M_color + 1));
    }
    _Var10._M_p = GetSources<cmTarget>(cmTarget_const*,cmMessenger*,cmListFileBacktrace_const&)::
                  srcs_abi_cxx11_._M_dataplus._M_p;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return _Var10._M_p;
}

Assistant:

const char* cmTargetPropertyComputer::GetSources<cmTarget>(
  cmTarget const* tgt, cmMessenger* messenger,
  cmListFileBacktrace const& context)
{
  cmStringRange entries = tgt->GetSourceEntries();
  if (entries.empty()) {
    return nullptr;
  }

  std::ostringstream ss;
  const char* sep = "";
  for (std::string const& entry : entries) {
    std::vector<std::string> files;
    cmSystemTools::ExpandListArgument(entry, files);
    for (std::string const& file : files) {
      if (cmHasLiteralPrefix(file, "$<TARGET_OBJECTS:") &&
          file.back() == '>') {
        std::string objLibName = file.substr(17, file.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          ss << sep;
          sep = ";";
          ss << file;
          continue;
        }

        bool addContent = false;
        bool noMessage = true;
        std::ostringstream e;
        MessageType messageType = MessageType::AUTHOR_WARNING;
        switch (context.GetBottom().GetPolicy(cmPolicies::CMP0051)) {
          case cmPolicies::WARN:
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
            noMessage = false;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::NEW:
            addContent = true;
        }
        if (!noMessage) {
          e << "Target \"" << tgt->GetName()
            << "\" contains $<TARGET_OBJECTS> generator expression in its "
               "sources list.  This content was not previously part of the "
               "SOURCES property when that property was read at configure "
               "time.  Code reading that property needs to be adapted to "
               "ignore the generator expression using the string(GENEX_STRIP) "
               "command.";
          messenger->IssueMessage(messageType, e.str(), context);
        }
        if (addContent) {
          ss << sep;
          sep = ";";
          ss << file;
        }
      } else if (cmGeneratorExpression::Find(file) == std::string::npos) {
        ss << sep;
        sep = ";";
        ss << file;
      } else {
        cmSourceFile* sf = tgt->GetMakefile()->GetOrCreateSource(file);
        // Construct what is known about this source file location.
        cmSourceFileLocation const& location = sf->GetLocation();
        std::string sname = location.GetDirectory();
        if (!sname.empty()) {
          sname += "/";
        }
        sname += location.GetName();

        ss << sep;
        sep = ";";
        // Append this list entry.
        ss << sname;
      }
    }
  }
  static std::string srcs;
  srcs = ss.str();
  return srcs.c_str();
}